

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O1

shared_ptr<KmerList> __thiscall
BatchKmersCounter::kmerCountOMP
          (BatchKmersCounter *this,uint8_t K,PairedReadsDatastore *reads,uint64_t gfrom,uint64_t gto
          ,uint64_t batch_size)

{
  void *__s;
  byte *pbVar1;
  byte bVar2;
  uint64_t uVar3;
  pointer psVar4;
  KmerList *other;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  _func_int *p_Var7;
  long lVar8;
  uint uVar9;
  undefined8 uVar10;
  bool bVar11;
  shared_ptr<KmerList> *psVar12;
  pointer pvVar13;
  ulong uVar14;
  ulong uVar15;
  ostream *poVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  undefined1 *puVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  ushort uVar22;
  atomic<unsigned_char> **bs;
  size_t new_size;
  ulong uVar23;
  long lVar24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  undefined7 in_register_00000031;
  undefined1 auVar26 [8];
  ulong uVar27;
  KmerList *pKVar28;
  ulong uVar29;
  ushort uVar30;
  uint64_t readID;
  ulong uVar31;
  atomic_uint_fast8_t (*__range1) [3531248];
  long lVar32;
  ulong uVar33;
  shared_ptr<KmerList> sVar34;
  undefined8 uStack_3c0;
  undefined1 local_3b8 [8];
  StreamKmerFactory128 skf;
  undefined1 local_160 [8];
  ReadSequenceBuffer bprsg;
  undefined1 auStack_b8 [8];
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> read_kmers;
  shared_ptr<KmerList> *kmer_list;
  vector<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_> batch_status;
  undefined1 auStack_58 [8];
  vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  batch_lists;
  shared_ptr<KmerList> local_kmer_list;
  
  batch_status.
  super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)CONCAT71(in_register_00000031,K);
  uVar29 = gto - gfrom;
  uVar27 = (uVar29 >> 2) + 1;
  if (batch_size != 0) {
    uVar27 = batch_size;
  }
  uVar14 = (uVar29 + uVar27) - 1;
  uVar22 = 0;
  uVar15 = uVar14 / uVar27;
  uStack_3c0 = 0x1d4e88;
  poVar16 = sdglib::OutputLog(INFO,true);
  uStack_3c0 = 0x1d4e9f;
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"OMP-merge kmer counting in ",0x1b);
  uStack_3c0 = 0x1d4eaa;
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  uStack_3c0 = 0x1d4ec1;
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," batches of ",0xc);
  uStack_3c0 = 0x1d4ed3;
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  uStack_3c0 = 0x1d4eea;
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," reads",6);
  uStack_3c0 = 0x1d4efe;
  std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + (char)poVar16);
  uStack_3c0 = 0x1d4f09;
  std::ostream::put((char)poVar16);
  uStack_3c0 = 0x1d4f11;
  std::ostream::flush();
  batch_status.
  super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  kmer_list = (shared_ptr<KmerList> *)0x0;
  batch_status.
  super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  batch_lists.
  super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  batch_lists.
  super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (1 < uVar15) {
    uVar22 = 0;
    uVar17 = uVar15;
    do {
      uStack_3c0 = 0x1d4f5a;
      local_3b8 = (undefined1  [8])calloc(1,uVar17);
      if (batch_status.
          super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          batch_status.
          super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uStack_3c0 = 0x1d4f80;
        std::vector<std::atomic<unsigned_char>*,std::allocator<std::atomic<unsigned_char>*>>::
        _M_realloc_insert<std::atomic<unsigned_char>*>
                  ((vector<std::atomic<unsigned_char>*,std::allocator<std::atomic<unsigned_char>*>>
                    *)&kmer_list,
                   (iterator)
                   batch_status.
                   super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,(atomic<unsigned_char> **)local_3b8);
      }
      else {
        *batch_status.
         super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
         ._M_impl.super__Vector_impl_data._M_start = (atomic<unsigned_char> *)local_3b8;
        batch_status.
        super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             batch_status.
             super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      if (batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uStack_3c0 = 0x1d4fa7;
        std::
        vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
        ::_M_realloc_insert<>
                  ((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                    *)auStack_58,
                   (iterator)
                   batch_lists.
                   super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        ((batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        batch_lists.
        super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             batch_lists.
             super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      uStack_3c0 = 0x1d4fb7;
      std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>::resize
                (batch_lists.
                 super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1,uVar17);
      uVar22 = uVar22 + 1;
      uVar31 = uVar17 + 1;
      uVar17 = uVar31 >> 1;
    } while (3 < uVar31);
  }
  uStack_3c0 = 0x1d4fd7;
  poVar16 = sdglib::OutputLog(INFO,true);
  uStack_3c0 = 0x1d4fee;
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Created ",8);
  uStack_3c0 = 0x1d4ffd;
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  uStack_3c0 = 0x1d5014;
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," levels",7);
  uStack_3c0 = 0x1d5028;
  std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + (char)poVar16);
  uStack_3c0 = 0x1d5033;
  std::ostream::put((char)poVar16);
  uStack_3c0 = 0x1d503b;
  std::ostream::flush();
  lVar8 = -(ulong)(uVar22 + 0xf & 0xfffffff0);
  lVar32 = (long)&skf + lVar8 + -8;
  if (uVar22 != 0) {
    uVar17 = 0;
    do {
      LOCK();
      *(undefined1 *)(lVar32 + uVar17) = 0;
      UNLOCK();
      uVar17 = uVar17 + 1;
    } while (uVar22 != uVar17);
  }
  *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5084;
  ReadSequenceBuffer::ReadSequenceBuffer((ReadSequenceBuffer *)local_160,reads,100000,1000);
  auStack_b8 = (undefined1  [8])0x0;
  read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (uVar27 <= uVar14) {
    uVar9 = (batch_status.
             super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0xff) * 2;
    uVar31 = -1L << ((byte)uVar9 & 0x3f);
    uVar14 = 0;
    uVar17 = uVar31;
    if ((uVar9 & 0x40) == 0) {
      uVar17 = 0xffffffffffffffff;
      uVar14 = uVar31;
    }
    uVar31 = 0;
    bprsg._56_8_ = lVar32;
    do {
      uVar19 = uVar29 - (uVar15 - 1) * uVar27;
      if (uVar31 < uVar15 - 1) {
        uVar19 = uVar27;
      }
      batch_lists.
      super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5174;
      local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(0x20);
      readID = uVar31 * uVar27 + gfrom;
      uVar33 = readID + uVar19;
      (local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size =
           0x100000001;
      (local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kmers =
           (KMerNodeFreq_s *)&PTR___Sp_counted_ptr_inplace_00258c98;
      pKVar28 = local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].kmers =
           (KMerNodeFreq_s *)0x0;
      local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].size = 0;
      uVar3 = reads->readsize;
      batch_lists.
      super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pKVar28;
      *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d51cf;
      KmerList::resize(pKVar28,(uVar19 + 1) * uVar3);
      local_3b8[0] = (char)batch_status.
                           super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      skf.super_KMerFactory128.fkmer._0_8_ = 0;
      skf.super_KMerFactory128.fkmer._8_8_ = 0;
      skf.super_KMerFactory128.K = '\0';
      skf.super_KMerFactory128._1_7_ = 0;
      skf.super_KMerFactory128.last_unknown = 0;
      skf.super_KMerFactory128.rkmer._0_8_ = 0;
      __s = (void *)((long)&skf.super_KMerFactory128.KMER_FIRSTOFFSET + 8);
      skf.super_KMerFactory128.rkmer._8_8_ = ~uVar14;
      skf.super_KMerFactory128.KMER_MASK._0_8_ = ~uVar17;
      skf.super_KMerFactory128.KMER_MASK._8_8_ = (ulong)uVar9 - 2;
      skf.super_KMerFactory128.KMER_FIRSTOFFSET._0_8_ = (ulong)(1 < (ulong)uVar9) - 1;
      *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d523f;
      memset(__s,0,0x100);
      skf.super_KMerFactory128.KMER_FIRSTOFFSET._8_1_ = 4;
      pcVar18 = skf.super_KMerFactory128.b2f._M_elems + 0xf8;
      *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d525c;
      memset(pcVar18,0,0x100);
      *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d526e;
      memset(__s,4,0xff);
      *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5280;
      memset(pcVar18,4,0xff);
      skf.super_KMerFactory128.b2f._M_elems[0x39] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0x59] = '\0';
      skf.super_KMerFactory128.b2f._M_elems[0x3b] = '\x01';
      skf.super_KMerFactory128.b2f._M_elems[0x5b] = '\x01';
      skf.super_KMerFactory128.b2f._M_elems[0x3f] = '\x02';
      skf.super_KMerFactory128.b2f._M_elems[0x5f] = '\x02';
      skf.super_KMerFactory128.b2f._M_elems[0x4c] = '\x03';
      skf.super_KMerFactory128.b2f._M_elems[0x6c] = '\x03';
      skf.super_KMerFactory128.b2r._M_elems[0x39] = '\x03';
      skf.super_KMerFactory128.b2r._M_elems[0x59] = '\x03';
      skf.super_KMerFactory128.b2r._M_elems[0x3b] = '\x02';
      skf.super_KMerFactory128.b2r._M_elems[0x5b] = '\x02';
      skf.super_KMerFactory128.b2r._M_elems[0x3f] = '\x01';
      skf.super_KMerFactory128.b2r._M_elems[0x5f] = '\x01';
      skf.super_KMerFactory128.b2r._M_elems[0x4c] = '\0';
      skf.super_KMerFactory128.b2r._M_elems[0x6c] = '\0';
      new_size = 0;
      while (pvVar13 = batch_lists.
                       super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage, readID = readID + 1,
            readID <= uVar33) {
        *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d530a;
        pcVar18 = ReadSequenceBuffer::get_read_sequence((ReadSequenceBuffer *)local_160,readID);
        *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5320;
        StreamKmerFactory128::produce_all_kmers
                  ((StreamKmerFactory128 *)local_3b8,pcVar18,
                   (vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)auStack_b8);
        if (auStack_b8 !=
            (undefined1  [8])
            read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          puVar20 = (undefined1 *)
                    ((long)((batch_lists.
                             super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + new_size * 0x11 + 0x10);
          auVar26 = auStack_b8;
          do {
            uVar10 = *(undefined8 *)((long)auVar26 + 8);
            *(long *)(puVar20 + -0x10) = (long)*(unsigned___int128 *)auVar26;
            *(undefined8 *)(puVar20 + -8) = uVar10;
            *puVar20 = 1;
            new_size = new_size + 1;
            auVar26 = (undefined1  [8])((long)auVar26 + 0x10);
            puVar20 = puVar20 + 0x11;
          } while (auVar26 !=
                   (undefined1  [8])
                   read_kmers.
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl
                   .super__Vector_impl_data._M_start);
        }
        if ((undefined1  [8])
            read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
            _M_impl.super__Vector_impl_data._M_start != auStack_b8) {
          read_kmers.super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_b8;
        }
      }
      *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5388;
      KmerList::resize((KmerList *)pvVar13,new_size);
      pvVar13 = batch_lists.
                super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5391;
      KmerList::sort((KmerList *)pvVar13);
      pvVar13 = batch_lists.
                super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d539e;
      KmerList::uniq((KmerList *)pvVar13);
      uVar30 = 0;
      do {
        uVar19 = (ulong)uVar30;
        LOCK();
        pbVar1 = (byte *)(bprsg._56_8_ + uVar19);
        bVar2 = *pbVar1;
        *pbVar1 = *pbVar1 + 1;
        UNLOCK();
        uVar33 = (ulong)bVar2;
        if (((long)(((pointer)((long)auStack_58 + uVar19 * 0x18))->
                   super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(((pointer)((long)auStack_58 + uVar19 * 0x18))->
                   super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) - 1U == uVar33) {
          *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d53e8;
          poVar16 = sdglib::OutputLog(INFO,true);
          *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d53ff;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"level ",6);
          *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d540b;
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar30 + 1);
          *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5422;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16," done.",6);
          p_Var7 = poVar16->_vptr_basic_ostream[-3];
          *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5436;
          std::ios::widen((char)p_Var7 + (char)poVar16);
          *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5441;
          std::ostream::put((char)poVar16);
          *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5449;
          std::ostream::flush();
        }
        if ((int)(uint)uVar30 < (int)(uVar22 - 1)) {
          if ((bVar2 & 1) == 0) {
            if (((long)(((pointer)((long)auStack_58 + uVar19 * 0x18))->
                       super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(((pointer)((long)auStack_58 + uVar19 * 0x18))->
                       super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 4) - 1U != uVar33)
            goto LAB_001d5475;
          }
          else {
            uVar23 = (ulong)(bVar2 - 1);
            while (pvVar13 = batch_lists.
                             super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  *(char *)((long)&(&(kmer_list->
                                     super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr)[uVar19]->kmers + uVar23) != '\x01') {
              *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d54e3;
              usleep(10);
            }
            uVar19 = (ulong)((uint)uVar30 * 8);
            LOCK();
            *(undefined1 *)
             (*(long *)((long)&(kmer_list->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr + uVar19) + uVar23) = 2;
            UNLOCK();
            LOCK();
            *(undefined1 *)
             (*(long *)((long)&(kmer_list->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr + uVar19) + uVar33) = 2;
            UNLOCK();
            lVar24 = uVar23 * 0x10;
            pKVar28 = *(KmerList **)
                       (*(long *)((long)&(((_Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                                            *)auStack_58)->_M_impl).super__Vector_impl_data._M_start
                                 + uVar19 * 3) + lVar24);
            *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5525;
            KmerList::merge((KmerList *)pvVar13,pKVar28);
            lVar32 = *(long *)((long)&(((_Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                                         *)auStack_58)->_M_impl).super__Vector_impl_data._M_start +
                              uVar19 * 3);
            *(undefined8 *)(lVar32 + lVar24) = 0;
            p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar32 + 8 + lVar24);
            *(undefined8 *)(lVar32 + 8 + lVar24) = 0;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5547;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
          }
          uVar30 = uVar30 + 1;
          bVar11 = true;
        }
        else {
LAB_001d5475:
          psVar4 = (((pointer)((long)auStack_58 + uVar19 * 0x18))->
                   super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + bVar2;
          (psVar4->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)
               batch_lists.
               super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d549c;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(psVar4->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                     ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_kmer_list);
          peVar6 = local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          batch_lists.
          super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          if (peVar6 != (element_type *)0x0) {
            *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d54b1;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
          }
          LOCK();
          *(undefined1 *)
           ((long)&(&(kmer_list->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                   [uVar19]->kmers + uVar33) = 1;
          UNLOCK();
          bVar11 = false;
        }
        peVar6 = local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      } while (bVar11);
      if (local_kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5562;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6);
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 < uVar15);
  }
  auVar26 = auStack_b8;
  if (auStack_b8 != (undefined1  [8])0x0) {
    uVar27 = (long)read_kmers.
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)auStack_b8;
    *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d559b;
    operator_delete((void *)auVar26,uVar27);
  }
  *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d55a7;
  ReadSequenceBuffer::~ReadSequenceBuffer((ReadSequenceBuffer *)local_160);
  psVar4 = batch_lists.
           super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1].
           super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar28 = (psVar4->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  other = psVar4[1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d55bb;
  KmerList::merge(pKVar28,other);
  psVar4 = batch_lists.
           super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1].
           super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(element_type **)this = (psVar4->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  p_Var5 = (psVar4->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var5;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  psVar4 = batch_lists.
           super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1].
           super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (psVar4->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  p_Var5 = (psVar4->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (psVar4->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d560e;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  psVar4 = batch_lists.
           super__Vector_base<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1].
           super__Vector_base<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4[1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  p_Var5 = psVar4[1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  psVar4[1].super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var25 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)kmer_list;
  psVar12 = (shared_ptr<KmerList> *)
            batch_status.
            super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d562e;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    p_Var25 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)kmer_list;
    psVar12 = (shared_ptr<KmerList> *)
              batch_status.
              super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; (shared_ptr<KmerList> *)p_Var25 != psVar12; p_Var25 = p_Var25 + 1) {
    peVar6 = ((__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> *)&p_Var25->_M_pi)->_M_ptr;
    *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5643;
    free(peVar6);
  }
  *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5655;
  poVar16 = sdglib::OutputLog(INFO,true);
  *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d566c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Total kmers processed ",0x16);
  *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d5678;
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  p_Var7 = poVar16->_vptr_basic_ostream[-3];
  *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d568f;
  std::ios::widen((char)p_Var7 + (char)poVar16);
  *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d569a;
  std::ostream::put((char)poVar16);
  *(undefined8 *)((long)&uStack_3c0 + lVar8) = 0x1d56a2;
  std::ostream::flush();
  uStack_3c0 = 0x1d56b2;
  std::
  vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
  ::~vector((vector<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>,_std::allocator<std::vector<std::shared_ptr<KmerList>,_std::allocator<std::shared_ptr<KmerList>_>_>_>_>
             *)auStack_58);
  _Var21._M_pi = extraout_RDX;
  if (kmer_list != (shared_ptr<KmerList> *)0x0) {
    uStack_3c0 = 0x1d56c7;
    operator_delete(kmer_list,
                    (long)batch_status.
                          super__Vector_base<std::atomic<unsigned_char>_*,_std::allocator<std::atomic<unsigned_char>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)kmer_list);
    _Var21._M_pi = extraout_RDX_00;
  }
  sVar34.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var21._M_pi;
  sVar34.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<KmerList>)sVar34.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::kmerCountOMP(uint8_t K, PairedReadsDatastore const &reads, uint64_t gfrom, uint64_t gto, uint64_t batch_size) {
    uint64_t totalKmers(0);
    //Compute how many "batches" will be used. and malloc a structure for them and a bool array to mark them "ready to process".
    //optionally, there could be a total count of "ready kmers" to set a limit for memory usage, if total count is too high, slaves would wait
    if (batch_size == 0) batch_size = (gto - gfrom) / (4 * omp_get_max_threads()) + 1;
    const uint64_t batches = ((gto - gfrom) + batch_size - 1) / batch_size;
    sdglib::OutputLog() << "OMP-merge kmer counting in " << batches << " batches of " << batch_size << " reads" << std::endl;

    std::vector<std::atomic_uint_fast8_t *> batch_status; //level->batch->status

    std::vector<std::vector<std::shared_ptr<KmerList>>> batch_lists; //level->batch-> pointer to batch
    uint16_t levels = 0;
    for (auto elements = batches; elements > 1; elements = (elements + 1) / 2) {
        batch_status.push_back((std::atomic_uint_fast8_t *) calloc(sizeof(std::atomic_uint_fast8_t), elements));
        batch_lists.emplace_back();
        batch_lists.back().resize(elements);
//        sdglib::OutputLog() << "level " << levels << " created with " << elements << " elements " << std::endl;
        ++levels;
    }
    sdglib::OutputLog() << "Created " << levels << " levels" << std::endl;
    std::atomic_uint_fast8_t level_count[levels]; //level->count
    for (auto &l:level_count)l = 0;

#pragma omp parallel shared(reads) reduction(+:totalKmers)
    {
        ReadSequenceBuffer bprsg(reads,100000,1000);
        std::vector<__uint128_t> read_kmers;
#pragma omp for schedule(dynamic)
        for (auto batch = 0; batch < batches; ++batch) {
            //==== Part 1: actually counting ====
            uint64_t from = gfrom + batch * batch_size;
            uint64_t read_count = (batch < batches - 1) ? batch_size : (gto - gfrom) - batch_size * (batches - 1);
            uint64_t to = from + read_count;

            std::shared_ptr<KmerList> local_kmer_list = std::make_shared<KmerList>();
            uint64_t total_good_length = reads.readsize*(to-from+1);
            local_kmer_list->resize(total_good_length);
            //Populate the kmer list
            uint64_t last_kmer=0;

            // Replace with generating all the kmers from the reads!
            StreamKmerFactory128 skf(K);

            for (uint64_t rid=from+1; rid<= to; ++rid) {
                skf.produce_all_kmers(bprsg.get_read_sequence(rid), read_kmers);
                for (const auto &rk: read_kmers){
                    local_kmer_list->kmers[last_kmer].kdata=rk;
                    local_kmer_list->kmers[last_kmer].count=1;
                    ++last_kmer;
                }
                read_kmers.clear();
            }

            totalKmers += last_kmer;
            //std::cout<<last_kmer<<" kmers inserted in a batch"<<std::endl;
            local_kmer_list->resize(last_kmer);
            local_kmer_list->sort();
            local_kmer_list->uniq();
            //std::cout<<local_kmer_list->size<<" unique kmers in a batch"<<std::endl;
            //std::sort(local_kmer_list->begin(), local_kmer_list->end());
            //collapse_entries(*local_kmer_list);

            //==== Part 2: merging till no results of same level available ====
            //merge_level=0
            uint16_t merge_level = 0;
            bool just_merged = true;
            //while (just merged)
            while (just_merged) {
                //   insert the list into this merge level's queue
                uint16_t slot = level_count[merge_level]++;
                if (slot == batch_lists[merge_level].size() - 1) {
#pragma omp critical
                    sdglib::OutputLog() << "level " << (merge_level+1) << " done." << std::endl;
                }
                //   if insertion number is odd or last batch:
                if (merge_level < levels - 1 and (slot % 2 == 1 or slot == batch_lists[merge_level].size() - 1)) {
                    // mix with the previous even number (using own list as base, this way we preserve locality)
                    if (slot % 2 == 1) {
                        while (batch_status[merge_level][slot - 1] != 1)
                            usleep(10); //wait for the previous batch to be finished.
                        batch_status[merge_level][slot - 1] = 2;
                        batch_status[merge_level][slot] = 2;
                        //inplace_count_merge(local_kmer_list, batch_lists[merge_level][slot - 1]);
                        local_kmer_list->merge(*batch_lists[merge_level][slot - 1]);
                        batch_lists[merge_level][slot - 1].reset();
                    }
                    //      increase level
                    ++merge_level;
                    just_merged = true;
                } else {
                    // no batch available for merging, next thread at this level will pick up
                    batch_lists[merge_level][slot] = local_kmer_list;
                    local_kmer_list.reset();
                    batch_status[merge_level][slot] = 1;
                    just_merged = false;
                }
                //IDEA: fixed partitioning can be used to keep 2*thread-number lists for longer.
            }
        }

    }


//    sdglib::OutputLog() << "Top level merge starting" << std::endl;
    //inplace_count_merge(batch_lists.back()[0], batch_lists.back()[1]);
    batch_lists.back()[0]->merge(*batch_lists.back()[1]);
//    sdglib::OutputLog() << "Top level merge done" << std::endl;
    std::shared_ptr<KmerList> kmer_list = batch_lists.back()[0];
    batch_lists.back()[0].reset();
    batch_lists.back()[1].reset();
    for (auto &bs:batch_status) free(bs);
//    sdglib::OutputLog() << "cleanup done" << std::endl;
    sdglib::OutputLog() << "Total kmers processed " << totalKmers << std::endl;
    return kmer_list;
}